

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall
lattice::graph::graph
          (graph *this,basis *bs,unitcell *cell,span_t *span,
          vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *boundary)

{
  supercell local_b0;
  
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  supercell::supercell(&local_b0,span);
  init(this,(EVP_PKEY_CTX *)bs);
  supercell::~supercell(&local_b0);
  return;
}

Assistant:

graph(const basis& bs, const unitcell& cell, const span_t& span,
        const std::vector<boundary_t>& boundary) {
    init(bs, cell, supercell(span), boundary);
  }